

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::MapEntryMessageComparator::operator()
          (MapEntryMessageComparator *this,Message *a,Message *b)

{
  FieldDescriptor *field;
  bool bVar1;
  int32_t iVar2;
  int32_t iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int64_t iVar6;
  int64_t iVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  Reflection *this_00;
  bool bVar10;
  Metadata MVar11;
  string first;
  string second;
  string sStack_68;
  string local_48;
  
  MVar11 = Message::GetMetadata(a);
  this_00 = MVar11.reflection;
  field = this->field_;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    iVar2 = Reflection::GetInt32(this_00,a,field);
    iVar3 = Reflection::GetInt32(this_00,b,this->field_);
    bVar1 = SBORROW4(iVar2,iVar3);
    bVar10 = iVar2 - iVar3 < 0;
    goto LAB_002b70f6;
  case 2:
    iVar6 = Reflection::GetInt64(this_00,a,field);
    iVar7 = Reflection::GetInt64(this_00,b,this->field_);
    bVar1 = SBORROW8(iVar6,iVar7);
    bVar10 = iVar6 - iVar7 < 0;
LAB_002b70f6:
    bVar10 = bVar1 != bVar10;
    break;
  case 3:
    uVar4 = Reflection::GetUInt32(this_00,a,field);
    uVar5 = Reflection::GetUInt32(this_00,b,this->field_);
    bVar10 = uVar4 < uVar5;
    break;
  case 4:
    uVar8 = Reflection::GetUInt64(this_00,a,field);
    uVar9 = Reflection::GetUInt64(this_00,b,this->field_);
    bVar10 = uVar8 < uVar9;
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&sStack_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x994);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&sStack_68,(char (*) [27])"Invalid key for map field.");
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&sStack_68);
    bVar10 = true;
    break;
  case 7:
    bVar1 = Reflection::GetBool(this_00,a,field);
    bVar10 = Reflection::GetBool(this_00,b,this->field_);
    bVar10 = !bVar1 && bVar10;
    break;
  case 9:
    Reflection::GetString_abi_cxx11_(&sStack_68,this_00,a,field);
    Reflection::GetString_abi_cxx11_(&local_48,this_00,b,this->field_);
    bVar10 = std::operator<(&sStack_68,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&sStack_68);
  }
  return bVar10;
}

Assistant:

bool operator()(const Message* a, const Message* b) {
    const Reflection* reflection = a->GetReflection();
    switch (field_->cpp_type()) {
      case FieldDescriptor::CPPTYPE_BOOL: {
        bool first = reflection->GetBool(*a, field_);
        bool second = reflection->GetBool(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_INT32: {
        int32_t first = reflection->GetInt32(*a, field_);
        int32_t second = reflection->GetInt32(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_INT64: {
        int64_t first = reflection->GetInt64(*a, field_);
        int64_t second = reflection->GetInt64(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_UINT32: {
        uint32_t first = reflection->GetUInt32(*a, field_);
        uint32_t second = reflection->GetUInt32(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64_t first = reflection->GetUInt64(*a, field_);
        uint64_t second = reflection->GetUInt64(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_STRING: {
        std::string first = reflection->GetString(*a, field_);
        std::string second = reflection->GetString(*b, field_);
        return first < second;
      }
      default:
        ABSL_DLOG(FATAL) << "Invalid key for map field.";
        return true;
    }
  }